

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_list_equal(lyd_node *first,lyd_node *second,int action,int withdefaults,int log)

{
  LYS_NODE LVar1;
  int iVar2;
  uint8_t *puVar3;
  LY_ERR *pLVar4;
  uint local_88;
  int local_84;
  int j;
  int i;
  uint16_t idx_uniq;
  uint16_t idx2;
  char *pcStack_78;
  uint16_t idx1;
  char *buf_backup;
  char *uniq_str;
  char *path2;
  char *path1;
  char *val2;
  char *val1;
  lyd_node *diter;
  lys_node *snode;
  lys_node_list *slist;
  int local_28;
  int log_local;
  int withdefaults_local;
  int action_local;
  lyd_node *second_local;
  lyd_node *first_local;
  
  diter = (lyd_node *)0x0;
  slist._4_4_ = log;
  local_28 = withdefaults;
  log_local = action;
  _withdefaults_local = second;
  second_local = first;
  buf_backup = ly_buf();
  pcStack_78 = (char *)0x0;
  if ((second_local == (lyd_node *)0x0) ||
     ((second_local->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN)) {
    __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x143c,"int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)")
    ;
  }
  if ((_withdefaults_local == (lyd_node *)0x0) ||
     ((_withdefaults_local->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN)) {
    __assert_fail("second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x143d,"int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)")
    ;
  }
  if (second_local->schema->nodetype != _withdefaults_local->schema->nodetype) {
    __assert_fail("first->schema->nodetype == second->schema->nodetype",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x143e,"int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)")
    ;
  }
  if (second_local->schema == _withdefaults_local->schema) {
    LVar1 = second_local->schema->nodetype;
    if (LVar1 == LYS_LEAFLIST) {
      if (((second_local->schema->flags & 2) == 0) ||
         (((byte)second_local->schema->module->field_0x40 >> 1 & 7) < 2)) {
        if ((second_local->child == _withdefaults_local->child) &&
           ((local_28 == 0 ||
            ((second_local->field_0x9 & 1) == (_withdefaults_local->field_0x9 & 1))))) {
          if (slist._4_4_ != 0) {
            ly_vlog(LYE_DUPLEAFLIST,LY_VLOG_LYD,_withdefaults_local,
                    _withdefaults_local->schema->name,_withdefaults_local->child);
          }
          first_local._4_4_ = 1;
        }
        else {
          first_local._4_4_ = 0;
        }
      }
      else {
        first_local._4_4_ = 0;
      }
    }
    else if (LVar1 == LYS_LIST) {
      snode = second_local->schema;
      if (log_local != 0) {
        if ((0 < log_local) && (local_84 = log_local + -1, local_84 < (int)(uint)snode->padding[3]))
        goto LAB_001900ae;
        for (local_84 = 0; local_84 < (int)(uint)snode->padding[3]; local_84 = local_84 + 1) {
LAB_001900ae:
          for (local_88 = 0;
              (int)local_88 < (int)(uint)*(byte *)(snode[1].ext + (long)local_84 * 2 + 1);
              local_88 = local_88 + 1) {
            val1 = (char *)resolve_data_descendant_schema_nodeid
                                     ((char *)(&snode[1].ext[(long)local_84 * 2]->def)
                                              [(int)local_88],second_local->child);
            if ((lyd_node *)val1 == (lyd_node *)0x0) {
              val2 = lyd_get_unique_default
                               ((char *)(&snode[1].ext[(long)local_84 * 2]->def)[(int)local_88],
                                second_local);
              pLVar4 = ly_errno_location();
              if (*pLVar4 != LY_SUCCESS) {
                return -1;
              }
            }
            else {
              val2 = (char *)((lyd_node *)val1)->child;
            }
            val1 = (char *)resolve_data_descendant_schema_nodeid
                                     ((char *)(&snode[1].ext[(long)local_84 * 2]->def)
                                              [(int)local_88],_withdefaults_local->child);
            if ((lyd_node *)val1 == (lyd_node *)0x0) {
              path1 = lyd_get_unique_default
                                ((char *)(&snode[1].ext[(long)local_84 * 2]->def)[(int)local_88],
                                 _withdefaults_local);
              pLVar4 = ly_errno_location();
              if (*pLVar4 != LY_SUCCESS) {
                return -1;
              }
            }
            else {
              path1 = (char *)((lyd_node *)val1)->child;
            }
            if (((val2 == (char *)0x0) || (path1 == (char *)0x0)) || (val2 != path1)) break;
          }
          if ((local_88 != 0) && (local_88 == *(byte *)(snode[1].ext + (long)local_84 * 2 + 1))) {
            if (slist._4_4_ == 0) {
              return 1;
            }
            path2 = (char *)malloc(0x400);
            uniq_str = (char *)malloc(0x400);
            if ((path2 != (char *)0x0) && (uniq_str != (char *)0x0)) {
              i._0_2_ = 0x3ff;
              i._2_2_ = 0x3ff;
              path2[0x3ff] = '\0';
              uniq_str[0x3ff] = '\0';
              ly_vlog_build_path_reverse
                        (LY_VLOG_LYD,second_local,path2,(uint16_t *)((long)&i + 2),0);
              ly_vlog_build_path_reverse(LY_VLOG_LYD,_withdefaults_local,uniq_str,(uint16_t *)&i,0);
              puVar3 = ly_buf_used_location();
              if ((*puVar3 != '\0') && (*buf_backup != '\0')) {
                pcStack_78 = strndup(buf_backup,0x3ff);
              }
              puVar3 = ly_buf_used_location();
              *puVar3 = *puVar3 + '\x01';
              j._2_2_ = 0;
              for (local_88 = 0;
                  (int)local_88 < (int)(uint)*(byte *)(snode[1].ext + (long)local_84 * 2 + 1);
                  local_88 = local_88 + 1) {
                if (local_88 != 0) {
                  buf_backup[j._2_2_] = ' ';
                  j._2_2_ = j._2_2_ + 1;
                }
                iVar2 = lyd_build_relative_data_path
                                  (second_local,
                                   (char *)(&snode[1].ext[(long)local_84 * 2]->def)[(int)local_88],
                                   buf_backup + j._2_2_);
                j._2_2_ = j._2_2_ + (short)iVar2;
              }
              ly_vlog(LYE_NOUNIQ,LY_VLOG_LYD,_withdefaults_local,buf_backup,path2 + i._2_2_,
                      uniq_str + (ushort)i);
              free(path2);
              free(uniq_str);
              if (pcStack_78 != (char *)0x0) {
                strcpy(buf_backup,pcStack_78);
                free(pcStack_78);
              }
              puVar3 = ly_buf_used_location();
              *puVar3 = *puVar3 + 0xff;
              return 1;
            }
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_list_equal");
            free(path2);
            free(uniq_str);
            return -1;
          }
          if (0 < log_local) {
            return 0;
          }
        }
      }
      if (snode->padding[2] == '\0') {
        first_local._4_4_ = 0;
      }
      else {
        for (local_84 = 0; local_84 < (int)(uint)snode->padding[2]; local_84 = local_84 + 1) {
          diter = *(lyd_node **)(*(long *)&snode[1].flags + (long)local_84 * 8);
          path1 = (char *)0x0;
          val2 = (char *)0x0;
          for (val1 = (char *)second_local->child; val1 != (char *)0x0;
              val1 = *(char **)(val1 + 0x18)) {
            if (*(lyd_node **)val1 == diter) {
              val2 = *(char **)(val1 + 0x30);
              break;
            }
          }
          for (val1 = (char *)_withdefaults_local->child; val1 != (char *)0x0;
              val1 = *(char **)(val1 + 0x18)) {
            if (*(lyd_node **)val1 == diter) {
              path1 = *(char **)(val1 + 0x30);
              break;
            }
          }
          if (val2 != path1) {
            return 0;
          }
        }
        if (slist._4_4_ != 0) {
          ly_vlog(LYE_DUPLIST,LY_VLOG_LYD,_withdefaults_local,_withdefaults_local->schema->name);
        }
        first_local._4_4_ = 1;
      }
    }
    else {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
             ,0x14d3);
      first_local._4_4_ = -1;
    }
  }
  else {
    first_local._4_4_ = 0;
  }
  return first_local._4_4_;
}

Assistant:

int
lyd_list_equal(struct lyd_node *first, struct lyd_node *second, int action, int withdefaults, int log)
{
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter;
    const char *val1, *val2;
    char *path1, *path2, *uniq_str = ly_buf(), *buf_backup = NULL;
    uint16_t idx1, idx2, idx_uniq;
    int i, j;

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(first->schema->nodetype == second->schema->nodetype);

    if (first->schema != second->schema) {
        return 0;
    }

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= 2) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)
                && (!withdefaults || (first->dflt == second->dflt))) {
            if (log) {
                LOGVAL(LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                       ((struct lyd_node_leaf_list *)second)->value_str);
            }
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare unique leafs */
        if (action) {
            if (action > 0) {
                i = action - 1;
                if (i < slist->unique_size) {
                    goto uniquecheck;
                }
            }
            for (i = 0; i < slist->unique_size; i++) {
uniquecheck:
                for (j = 0; j < slist->unique[i].expr_size; j++) {
                    /* first */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], first->child);
                    if (diter) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val1 = lyd_get_unique_default(slist->unique[i].expr[j], first);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    /* second */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], second->child);
                    if (diter) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val2 = lyd_get_unique_default(slist->unique[i].expr[j], second);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    if (!val1 || !val2 || !ly_strequal(val1, val2, 1)) {
                        /* values differ */
                        break;
                    }
                }
                if (j && (j == slist->unique[i].expr_size)) {
                    /* all unique leafs are the same in this set, create this nice error */
                    if (!log) {
                        return 1;
                    }

                    path1 = malloc(LY_BUF_SIZE);
                    path2 = malloc(LY_BUF_SIZE);
                    if (!path1 || !path2) {
                        LOGMEM;
                        free(path1);
                        free(path2);
                        return -1;
                    }
                    idx1 = idx2 = LY_BUF_SIZE - 1;
                    path1[idx1] = '\0';
                    path2[idx2] = '\0';
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, first, path1, &idx1, 0);
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, second, path2, &idx2, 0);

                    /* use internal buffer to rebuild the unique string */
                    if (ly_buf_used && uniq_str[0]) {
                        buf_backup = strndup(uniq_str, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;
                    idx_uniq = 0;

                    for (j = 0; j < slist->unique[i].expr_size; ++j) {
                        if (j) {
                            uniq_str[idx_uniq++] = ' ';
                        }
                        idx_uniq += lyd_build_relative_data_path(first, slist->unique[i].expr[j], &uniq_str[idx_uniq]);
                    }

                    LOGVAL(LYE_NOUNIQ, LY_VLOG_LYD, second, uniq_str, &path1[idx1], &path2[idx2]);
                    free(path1);
                    free(path2);
                    if (buf_backup) {
                        strcpy(uniq_str, buf_backup);
                        free(buf_backup);
                    }
                    ly_buf_used--;
                    return 1;
                }

                if (action > 0) {
                    /* done */
                    return 0;
                }
            }
        }

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        if (log) {
            LOGVAL(LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        }
        return 1;
    default:
        LOGINT;
        return -1;
    }
}